

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map.h
# Opt level: O1

pair<std::pair<const_int,_int>_*,_std::pair<const_int,_int>_*> __thiscall
frozen::unordered_map<int,_int,_3UL,_frozen::elsa<int>,_std::equal_to<int>_>::equal_range<int>
          (unordered_map<int,_int,_3UL,_frozen::elsa<int>,_std::equal_to<int>_> *this,int *key)

{
  tables_type *this_00;
  pair<const_int,_int> *ppVar1;
  size_t sVar2;
  long lVar3;
  pair<const_int,_int> *ppVar4;
  pair<std::pair<const_int,_int>_*,_std::pair<const_int,_int>_*> pVar5;
  
  this_00 = &this->tables_;
  sVar2 = bits::pmh_tables<8ul,frozen::elsa<int>>::lookup<int,frozen::elsa<int>>
                    ((pmh_tables<8ul,frozen::elsa<int>> *)this_00,key,(elsa<int> *)this_00);
  if ((sVar2 == 3) || ((this->items_).data_[sVar2].first != *key)) {
    lVar3 = 0x18;
  }
  else {
    lVar3 = sVar2 << 3;
  }
  ppVar4 = (pair<const_int,_int> *)((long)&(this->items_).data_[1].first + lVar3);
  ppVar1 = (pair<const_int,_int> *)((long)&(this->items_).data_[0].first + lVar3);
  if (lVar3 == 0x18) {
    ppVar4 = (pair<const_int,_int> *)this_00;
    ppVar1 = (pair<const_int,_int> *)this_00;
  }
  pVar5.second = ppVar4;
  pVar5.first = ppVar1;
  return pVar5;
}

Assistant:

constexpr std::pair<iterator, iterator> equal_range(KeyType const &key) {
    return equal_range_impl(*this, key);
  }